

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::WriteIndent(TextGenerator *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  void *void_buffer;
  BaseTextGenerator local_38 [2];
  
  if (this->indent_level_ != 0) {
    if (this->failed_ == true) {
      WriteIndent((TextGenerator *)local_38);
    }
    iVar2 = (*(this->super_BaseTextGenerator)._vptr_BaseTextGenerator[4])(this);
    uVar4 = this->buffer_size_;
    if ((int)uVar4 < iVar2) {
      do {
        if (0 < (int)uVar4) {
          memset(this->buffer_,0x20,(ulong)uVar4);
          uVar4 = this->buffer_size_;
        }
        iVar3 = (*this->output_->_vptr_ZeroCopyOutputStream[2])
                          (this->output_,local_38,&this->buffer_size_);
        bVar1 = (bool)((byte)iVar3 ^ 1);
        this->failed_ = bVar1;
        if (bVar1 != false) {
          return;
        }
        iVar2 = iVar2 - uVar4;
        this->buffer_ = (char *)local_38[0]._vptr_BaseTextGenerator;
        uVar4 = this->buffer_size_;
      } while ((int)uVar4 < iVar2);
    }
    else {
      local_38[0]._vptr_BaseTextGenerator = (_func_int **)this->buffer_;
    }
    memset(local_38[0]._vptr_BaseTextGenerator,0x20,(long)iVar2);
    this->buffer_ = this->buffer_ + iVar2;
    this->buffer_size_ = this->buffer_size_ - iVar2;
  }
  return;
}

Assistant:

void WriteIndent() {
    if (indent_level_ == 0) {
      return;
    }
    ABSL_DCHECK(!failed_);
    int size = GetCurrentIndentationSize();

    while (size > buffer_size_) {
      // Data exceeds space in the buffer. Write what we can and request a new
      // buffer.
      if (buffer_size_ > 0) {
        memset(buffer_, ' ', buffer_size_);
      }
      size -= buffer_size_;
      void* void_buffer;
      failed_ = !output_->Next(&void_buffer, &buffer_size_);
      if (failed_) return;
      buffer_ = reinterpret_cast<char*>(void_buffer);
    }

    // Buffer is big enough to receive the data; copy it.
    memset(buffer_, ' ', size);
    buffer_ += size;
    buffer_size_ -= size;
  }